

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscriber_link.cpp
# Opt level: O1

string * __thiscall miniros::SubscriberLink::getMD5Sum_abi_cxx11_(SubscriberLink *this)

{
  int iVar1;
  int iVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar4;
  
  this_00 = (this->parent_).super___weak_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar2 = this_00->_M_use_count;
    do {
      if (iVar2 == 0) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar4 = iVar2 == iVar1;
      if (bVar4) {
        this_00->_M_use_count = iVar2 + 1;
        iVar1 = iVar2;
      }
      iVar2 = iVar1;
      UNLOCK();
    } while (!bVar4);
  }
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar4 = true;
  }
  else {
    bVar4 = this_00->_M_use_count == 0;
  }
  peVar3 = (this->parent_).super___weak_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (bVar4) {
    peVar3 = (element_type *)0x0;
  }
  return &peVar3->md5sum_;
}

Assistant:

const std::string& SubscriberLink::getMD5Sum()
{
  PublicationPtr parent = parent_.lock();
  return parent->getMD5Sum();
}